

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

BinsSelectExpressionSyntax * __thiscall
slang::parsing::Parser::parseBinsSelectExpression(Parser *this)

{
  Token op_00;
  bool bVar1;
  SyntaxFactory *this_00;
  long in_RDI;
  Token TVar2;
  Token op;
  BinsSelectExpressionSyntax *curr;
  Parser *in_stack_000000f0;
  BinsSelectExpressionSyntax *in_stack_ffffffffffffffa8;
  undefined6 uVar3;
  TokenKind in_stack_ffffffffffffffbe;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  ParserBase *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  undefined8 local_10;
  
  local_10 = (BinaryBinsSelectExprSyntax *)parseBinsSelectPrimary(in_stack_000000f0);
  while( true ) {
    bVar1 = ParserBase::peek((ParserBase *)
                             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                             in_stack_ffffffffffffffbe);
    in_stack_ffffffffffffffc7 = true;
    if (!bVar1) {
      in_stack_ffffffffffffffc7 =
           ParserBase::peek((ParserBase *)CONCAT17(1,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbe);
    }
    if ((bool)in_stack_ffffffffffffffc7 == false) break;
    TVar2 = ParserBase::consume(in_stack_ffffffffffffffd0);
    this_00 = (SyntaxFactory *)(in_RDI + 0xe0);
    uVar3 = SUB86(local_10,0);
    in_stack_ffffffffffffffbe = (TokenKind)((ulong)local_10 >> 0x30);
    local_20 = TVar2._0_8_;
    parseBinsSelectPrimary(in_stack_000000f0);
    op_00.rawLen._2_2_ = in_stack_ffffffffffffffbe;
    op_00._0_6_ = uVar3;
    op_00.info._0_7_ = in_stack_ffffffffffffffc0;
    op_00.info._7_1_ = in_stack_ffffffffffffffc7;
    local_10 = slang::syntax::SyntaxFactory::binaryBinsSelectExpr
                         (this_00,in_stack_ffffffffffffffa8,op_00,
                          (BinsSelectExpressionSyntax *)0xa4bdcc);
    in_stack_ffffffffffffffd0 = local_20;
  }
  return &local_10->super_BinsSelectExpressionSyntax;
}

Assistant:

BinsSelectExpressionSyntax& Parser::parseBinsSelectExpression() {
    auto curr = &parseBinsSelectPrimary();
    while (peek(TokenKind::DoubleAnd) || peek(TokenKind::DoubleOr)) {
        auto op = consume();
        curr = &factory.binaryBinsSelectExpr(*curr, op, parseBinsSelectPrimary());
    }
    return *curr;
}